

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

UdpSimpleFieldSyntax * __thiscall
slang::BumpAllocator::emplace<slang::syntax::UdpSimpleFieldSyntax,slang::parsing::Token>
          (BumpAllocator *this,Token *args)

{
  Token field;
  UdpSimpleFieldSyntax *pUVar1;
  Info *in_RSI;
  BumpAllocator *in_RDI;
  size_t in_stack_ffffffffffffffe8;
  
  pUVar1 = (UdpSimpleFieldSyntax *)allocate(in_RDI,(size_t)in_RSI,in_stack_ffffffffffffffe8);
  field.info = in_RSI;
  field._0_8_ = in_RSI->location;
  slang::syntax::UdpSimpleFieldSyntax::UdpSimpleFieldSyntax
            ((UdpSimpleFieldSyntax *)in_RSI->rawTextPtr,field);
  return pUVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }